

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contacts.cpp
# Opt level: O0

void __thiscall IContactList::RemoveContact(IContactList *this,char *pName,char *pClan)

{
  uint uVar1;
  uint uVar2;
  char *in_RDX;
  char *in_RSI;
  IContactList *in_RDI;
  int i;
  uint ClanHash;
  uint NameHash;
  int in_stack_ffffffffffffffcc;
  int local_24;
  
  uVar1 = str_quickhash(in_RSI);
  uVar2 = str_quickhash(in_RDX);
  local_24 = 0;
  while( true ) {
    if (in_RDI->m_NumContacts <= local_24) {
      return;
    }
    if ((in_RDI->m_aContacts[local_24].m_NameHash == uVar1) &&
       (in_RDI->m_aContacts[local_24].m_ClanHash == uVar2)) break;
    local_24 = local_24 + 1;
  }
  RemoveContact(in_RDI,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

void IContactList::RemoveContact(const char *pName, const char *pClan)
{
	unsigned NameHash = str_quickhash(pName);
	unsigned ClanHash = str_quickhash(pClan);
	for(int i = 0; i < m_NumContacts; ++i)
	{
		if(m_aContacts[i].m_NameHash == NameHash && m_aContacts[i].m_ClanHash == ClanHash)
		{
			RemoveContact(i);
			return;
		}
	}
}